

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConsumer.cpp
# Opt level: O2

optional<Vault::AuthenticationResponse> *
Vault::HttpConsumer::authenticate
          (optional<Vault::AuthenticationResponse> *__return_storage_ptr__,Client *client,Url *url,
          NoArgJsonProducer *jsonProducer)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  reference pvVar3;
  undefined4 extraout_var_00;
  Token token;
  HttpResponseBodyString body;
  input_adapter local_158;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_148;
  undefined1 local_138 [64];
  optional<Vault::HttpResponse> response;
  _Any_data local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  _Optional_payload_base<Vault::HttpResponse> local_80;
  
  iVar2 = (*client->_vptr_Client[10])(client);
  (*client->_vptr_Client[8])(local_138,client);
  (*client->_vptr_Client[9])(&body,client);
  std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  ::operator()(&token.value_,jsonProducer);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x18))
            (&response,(long *)CONCAT44(extraout_var,iVar2),url,local_138,&body,&token);
  std::__cxx11::string::~string((string *)&token);
  std::__cxx11::string::~string((string *)&body);
  std::__cxx11::string::~string((string *)local_138);
  std::_Optional_base<Vault::HttpResponse,_false,_false>::_Optional_base
            ((_Optional_base<Vault::HttpResponse,_false,_false> *)&local_80,
             &response.super__Optional_base<Vault::HttpResponse,_false,_false>);
  bVar1 = HttpClient::is_success((optional<Vault::HttpResponse> *)&local_80);
  std::_Optional_payload_base<Vault::HttpResponse>::_M_reset(&local_80);
  if (bVar1) {
    if (response.super__Optional_base<Vault::HttpResponse,_false,_false>._M_payload.
        super__Optional_payload<Vault::HttpResponse,_true,_false,_false>.
        super__Optional_payload_base<Vault::HttpResponse>._M_engaged == false) {
      std::__throw_bad_optional_access();
    }
    std::__cxx11::string::string
              ((string *)&body,
               (string *)
               &response.super__Optional_base<Vault::HttpResponse,_false,_false>._M_payload.
                super__Optional_payload<Vault::HttpResponse,_true,_false,_false>.
                super__Optional_payload_base<Vault::HttpResponse>._M_payload._M_value.body);
    nlohmann::detail::input_adapter::
    input_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_158,&body.value_);
    local_98 = 0;
    uStack_90 = 0;
    local_a8._M_unused._M_object = (void *)0x0;
    local_a8._8_8_ = 0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::parse(&local_148,&local_158,(parser_callback_t *)&local_a8,true);
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)&local_148,"auth");
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)pvVar3,"client_token");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,pvVar3
              );
    token.value_._M_dataplus._M_p = (pointer)&token.value_.field_2;
    if ((undefined1 *)local_138._0_8_ == local_138 + 0x10) {
      token.value_.field_2._8_8_ = local_138._24_8_;
    }
    else {
      token.value_._M_dataplus._M_p = (pointer)local_138._0_8_;
    }
    token.value_._M_string_length = local_138._8_8_;
    local_138._8_8_ = 0;
    local_138[0x10] = '\0';
    local_138._0_8_ = local_138 + 0x10;
    std::__cxx11::string::~string((string *)local_138);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json(&local_148);
    std::_Function_base::~_Function_base((_Function_base *)&local_a8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_158.ia.
                super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__cxx11::string::string((string *)local_138,(string *)&body);
    std::__cxx11::string::string((string *)(local_138 + 0x20),(string *)&token);
    std::optional<Vault::AuthenticationResponse>::optional<Vault::AuthenticationResponse,_true>
              (__return_storage_ptr__,(AuthenticationResponse *)local_138);
    AuthenticationResponse::~AuthenticationResponse((AuthenticationResponse *)local_138);
    std::__cxx11::string::~string((string *)&token);
    std::__cxx11::string::~string((string *)&body);
  }
  else {
    if (response.super__Optional_base<Vault::HttpResponse,_false,_false>._M_payload.
        super__Optional_payload<Vault::HttpResponse,_true,_false,_false>.
        super__Optional_payload_base<Vault::HttpResponse>._M_engaged == true) {
      iVar2 = (*client->_vptr_Client[10])(client);
      if (response.super__Optional_base<Vault::HttpResponse,_false,_false>._M_payload.
          super__Optional_payload<Vault::HttpResponse,_true,_false,_false>.
          super__Optional_payload_base<Vault::HttpResponse>._M_engaged == false) {
        std::__throw_bad_optional_access();
      }
      HttpClient::handleResponseError
                ((HttpClient *)CONCAT44(extraout_var_00,iVar2),(HttpResponse *)&response);
    }
    (__return_storage_ptr__->super__Optional_base<Vault::AuthenticationResponse,_false,_false>).
    _M_payload.super__Optional_payload<Vault::AuthenticationResponse,_true,_false,_false>.
    super__Optional_payload_base<Vault::AuthenticationResponse>._M_engaged = false;
  }
  std::_Optional_payload_base<Vault::HttpResponse>::_M_reset
            ((_Optional_payload_base<Vault::HttpResponse> *)&response);
  return __return_storage_ptr__;
}

Assistant:

std::optional<Vault::AuthenticationResponse>
Vault::HttpConsumer::authenticate(const Vault::Client &client,
                                  const Vault::Url &url,
                                  const NoArgJsonProducer &jsonProducer) {
  auto response = client.getHttpClient().post(
      url, client.getToken(), client.getNamespace(), jsonProducer());

  if (HttpClient::is_success(response)) {
    auto body = Vault::HttpResponseBodyString{response.value().body};
    auto token = Vault::Token{
        nlohmann::json::parse(body.value())["auth"]["client_token"]};

    return AuthenticationResponse{body, token};
  }

  if (response) {
    client.getHttpClient().handleResponseError(response.value());
  }

  return std::nullopt;
}